

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UText * utext_openUChars_63(UText *ut,UChar *s,int64_t length,UErrorCode *status)

{
  UText *pUVar1;
  int64_t iVar2;
  UChar *pUVar3;
  
  if (U_ZERO_ERROR < *status) {
    return (UText *)0x0;
  }
  pUVar3 = L"";
  if (s != (UChar *)0x0 || length != 0) {
    pUVar3 = s;
  }
  if (length - 0x80000000U < 0xffffffff7fffffff || pUVar3 == (UChar *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    pUVar1 = (UText *)0x0;
  }
  else {
    pUVar1 = utext_setup_63(ut,0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar1->pFuncs = &ucstrFuncs;
      pUVar1->context = pUVar3;
      pUVar1->providerProperties = (uint)(length == -1) * 2 + 4;
      pUVar1->a = length;
      pUVar1->chunkContents = pUVar3;
      pUVar1->chunkNativeStart = 0;
      iVar2 = 0;
      if (0 < length) {
        iVar2 = length;
      }
      pUVar1->chunkNativeLimit = iVar2;
      pUVar1->chunkLength = (int32_t)iVar2;
      pUVar1->chunkOffset = 0;
      pUVar1->nativeIndexingLimit = (int32_t)iVar2;
    }
  }
  return pUVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }